

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * __thiscall
cfd::core::CryptoUtil::DecryptAes256CbcToString_abi_cxx11_
          (string *__return_storage_ptr__,CryptoUtil *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *iv,ByteData *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  ByteData decrypt_data;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ByteData::ByteData((ByteData *)&local_60,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  ByteData::ByteData((ByteData *)&local_48,key);
  DecryptAes256Cbc((ByteData *)&local_30,(ByteData *)&local_60,(ByteData *)&local_48,(ByteData *)iv)
  ;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                     (ByteData *)&local_30);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append
            ((char *)__return_storage_ptr__,(ulong)local_60._M_impl.super__Vector_impl_data._M_start
            );
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string CryptoUtil::DecryptAes256CbcToString(
    const std::vector<uint8_t> &key, const std::vector<uint8_t> &iv,
    const ByteData &data) {
  ByteData decrypt_data = DecryptAes256Cbc(ByteData(key), ByteData(iv), data);
  std::vector<uint8_t> output = decrypt_data.GetBytes();
  std::string decrypt_string;
  decrypt_string.append(
      reinterpret_cast<const char *>(output.data()), output.size());
  return decrypt_string;
}